

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O0

void __thiscall StaticSynapse::update(StaticSynapse *this)

{
  value_type pEVar1;
  long *plVar2;
  reference ppEVar3;
  Scalar *pSVar4;
  long in_RDI;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar5;
  int iVar6;
  
  for (iVar6 = 0; iVar6 < *(int *)(in_RDI + 0x3c); iVar6 = iVar6 + 1) {
    for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 0x38); iVar5 = iVar5 + 1) {
      ppEVar3 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(*(long *)(in_RDI + 8) + 8),
                           (long)iVar5);
      pEVar1 = *ppEVar3;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          CONCAT44(iVar6,iVar5),in_RDI,
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      in_stack_ffffffffffffffe4 = iVar6;
      (**pEVar1->_vptr_Event)(*pSVar4);
      plVar2 = *(long **)(in_RDI + 0x10);
      iVar6 = in_stack_ffffffffffffffe4;
      ppEVar3 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(*(long *)(in_RDI + 8) + 8),
                           (long)iVar5);
      (**(code **)(*plVar2 + 0x28))(plVar2,in_stack_ffffffffffffffe4,*ppEVar3);
    }
  }
  return;
}

Assistant:

void StaticSynapse::update() {
    for(int i = 0; i < outputSize; i++) {
        for(int j = 0; j < inputSize; j++) {
            from_population->output[j]->setWeight(weights(j, i));
            to_population->setInput(i, from_population->output[j]);
        }
    }
}